

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void __thiscall djb::tab::extract_ndf(tab *this,brdf *brdf)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int j1;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int i1;
  int iVar13;
  int iVar14;
  int j2;
  long lVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float __x;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  vector<double,_std::allocator<double>_> v;
  float local_ec;
  tab *local_e8;
  float local_dc;
  ulong local_d8;
  ulong local_d0;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> frp_v;
  matrix km;
  vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_> io;
  
  iVar1 = this->m_zres;
  uVar11 = (long)iVar1 - 1;
  uVar2 = this->m_pres;
  iVar12 = (int)uVar11;
  local_e8 = this;
  matrix::matrix(&km,iVar12 * uVar2);
  io.
  super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  io.
  super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  io.
  super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fVar27 = (float)iVar12;
  fVar28 = (float)(int)uVar2;
  uVar5 = 0;
  uVar8 = 0;
  if (0 < iVar12) {
    uVar8 = uVar11 & 0xffffffff;
  }
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    fVar17 = ((float)(int)uVar5 / fVar28 + (float)(int)uVar5 / fVar28) * 3.1415927;
    for (iVar13 = 0; (int)uVar8 != iVar13; iVar13 = iVar13 + 1) {
      fVar18 = ((float)iVar13 / fVar27) * ((float)iVar13 / fVar27) * 3.1415927 * 0.5;
      fVar19 = cosf(fVar18);
      fVar18 = sinf(fVar18);
      fVar20 = cosf(fVar17);
      fVar21 = sinf(fVar17);
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      ._4_4_ = fVar21 * fVar18;
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      ._0_4_ = fVar20 * fVar18;
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = fVar19;
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = fVar20 * fVar18;
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start._4_4_;
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = fVar19;
      std::vector<std::pair<djb::vec3,djb::vec3>,std::allocator<std::pair<djb::vec3,djb::vec3>>>::
      emplace_back<std::pair<djb::vec3,djb::vec3>>
                ((vector<std::pair<djb::vec3,djb::vec3>,std::allocator<std::pair<djb::vec3,djb::vec3>>>
                  *)&io,(pair<djb::vec3,_djb::vec3> *)&v);
    }
  }
  (*brdf->_vptr_brdf[3])(&v,brdf,&io);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::_M_move_assign
            (&frp_v,&v);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&v);
  local_d8 = (ulong)uVar4;
  iVar13 = 0;
  local_d0 = uVar8;
  for (uVar6 = 0; uVar6 != local_d8; uVar6 = uVar6 + 1) {
    fVar17 = (float)(int)uVar6 / fVar28;
    fVar17 = (fVar17 + fVar17) * 3.1415927;
    iVar7 = iVar13;
    for (uVar8 = 0; uVar8 != local_d0; uVar8 = uVar8 + 1) {
      fVar18 = (float)(int)uVar8 / fVar27;
      fVar18 = fVar18 * fVar18 * 3.1415927 * 0.5;
      local_dc = cosf(fVar18);
      fVar18 = sinf(fVar18);
      fVar19 = cosf(fVar17);
      fVar20 = sinf(fVar17);
      std::valarray<float>::valarray
                ((valarray<float> *)&v,
                 frp_v.
                 super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar8 + uVar6 * uVar11);
      fVar21 = std::valarray<float>::sum((valarray<float> *)&v);
      uVar3 = CONCAT44(v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_);
      iVar14 = 0;
      for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
        __x = ((float)(int)uVar5 / fVar28 + (float)(int)uVar5 / fVar28) * 3.1415927;
        for (iVar10 = 0; iVar12 != iVar10; iVar10 = iVar10 + 1) {
          fVar22 = (float)iVar10 / fVar27;
          fVar23 = fVar22 * fVar22 * 3.1415927 * 0.5;
          fVar24 = cosf(fVar23);
          fVar25 = sinf(fVar23);
          fVar23 = cosf(__x);
          fVar26 = sinf(__x);
          fVar24 = fVar24 * local_dc +
                   fVar26 * fVar25 * fVar20 * fVar18 + fVar23 * fVar25 * fVar19 * fVar18;
          fVar23 = 0.0;
          if (0.0 <= fVar24) {
            fVar23 = fVar24;
          }
          fVar24 = 1.0;
          if (fVar23 <= 1.0) {
            fVar24 = fVar23;
          }
          km.mij.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_start[km.size * iVar7 + iVar14 + iVar10] =
               (double)(fVar24 * fVar22 * fVar25) *
               (double)(fVar21 / (float)uVar3) * (3.1415927410125732 / (double)iVar12) *
               (6.2831854820251465 / (double)(int)uVar2);
        }
        iVar14 = iVar14 + iVar12;
      }
      operator_delete((void *)CONCAT44(v.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                       .super__Vector_impl_data._M_finish._4_4_,
                                       v.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                       .super__Vector_impl_data._M_finish._0_4_));
      iVar7 = iVar7 + 1;
    }
    iVar13 = iVar13 + iVar12;
  }
  matrix::eigenvector(&v,&km,4);
  local_e8 = (tab *)&local_e8->m_ndf;
  lVar9 = 0;
  uVar11 = 0;
  while (uVar8 = local_d0, lVar15 = lVar9, uVar11 != local_d8) {
    while (bVar16 = uVar8 != 0, uVar8 = uVar8 - 1, bVar16) {
      local_ec = (float)*(double *)
                         (CONCAT44(v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_4_) + lVar15);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                ((vector<float,_std::allocator<float>_> *)local_e8,&local_ec);
      lVar15 = lVar15 + 8;
    }
    uVar11 = uVar11 + 1;
    lVar15 = (long)(iVar12 * (int)uVar11);
    fVar27 = (float)*(double *)
                     (CONCAT44(v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_) + -8 + lVar15 * 8);
    fVar27 = (fVar27 + fVar27) -
             (float)*(double *)
                     (CONCAT44(v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_) + -0x10 + lVar15 * 8);
    local_ec = 0.0;
    if (0.0 <= fVar27) {
      local_ec = fVar27;
    }
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)local_e8,&local_ec);
    lVar9 = lVar9 + (long)iVar1 * 8 + -8;
  }
  fwrite("djb_verbose: NDF extraction complete\n",0x25,1,_stdout);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v.super__Vector_base<double,_std::allocator<double>_>);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&frp_v);
  std::
  _Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>::
  ~_Vector_base(&io.
                 super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
               );
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&km);
  return;
}

Assistant:

void tab::extract_ndf(const brdf &brdf)
{
	const int w = m_zres - 1;
	const int h = m_pres;
	const double du1 = (double)m_pi() / w;
	const double du2 = 2 * (double)m_pi() / h;
	matrix km(w * h);
	std::vector<brdf::io_pair> io;
	std::vector<brdf::value_type> frp_v;

	// evaluate all directions
	for (int i2 = 0; i2 < h; ++i2)
	for (int i1 = 0; i1 < w; ++i1) {
		float_t u1 = (float_t)i1 / w; // in [0, 1)
		float_t u2 = (float_t)i2 / h; // in [0, 1)
		float_t ti = sqr(u1) * m_pi() / 2; // in [0, pi/2)
		float_t pi = u2 * 2 * m_pi(); // in [0, 2pi)
		float_t zi = cos(ti), z_i = sin(ti);
		vec3 wi = vec3(z_i * cos(pi), z_i * sin(pi), zi);

		io.push_back(brdf::io_pair(wi, wi));
	}
	frp_v = brdf.eval_batch(io);

	// build kernel
	for (int i2 = 0; i2 < h; ++i2)
	for (int i1 = 0; i1 < w; ++i1) {
		float_t u1_i = (float_t)i1 / w; // in [0, 1)
		float_t u2_i = (float_t)i2 / h; // in [0, 1)
		float_t ti = sqr(u1_i) * m_pi() / 2; // in [0, pi/2)
		float_t pi = u2_i * 2 * m_pi(); // in [0, 2pi)
		float_t zi = cos(ti), z_i = sin(ti);
		vec3 wi = vec3(z_i * cos(pi), z_i * sin(pi), zi);
		brdf::value_type frp = frp_v[i1 + w * i2];
		float_t frp_i = frp.sum() / frp.size();//dot(frp, vec3(0.2126, 0.7152, 0.0722));
		double kji_tmp = (double)frp_i * du1 * du2;

		for (int j2 = 0; j2 < h; ++j2)
		for (int j1 = 0; j1 < w; ++j1) {
			float_t u1_m = (float_t)j1 / w; // in [0, 1)
			float_t u2_m = (float_t)j2 / h; // in [0, 1)
			float_t tm = sqr(u1_m) * m_pi() / 2; // in [0, pi/2)
			float_t pm = u2_m * 2 * m_pi();      // in [0, 2pi)
			float_t zm = cos(tm), z_m = sin(tm);
			vec3 wm = vec3(z_m * cos(pm), z_m * sin(pm), zm);
			float_t dp = sat(dot(wm, wi));

			km(j1 + w * j2, i1 + w * i2) = kji_tmp * (double)(u1_m * dp * z_m);
		}
	}

	// compute slope pdf
	const std::vector<double> v = km.eigenvector(4);

	// store NDF
	for (int j = 0; j < h; ++j) {
		for (int i = 0; i < w; ++i) {
			m_ndf.push_back(v[i + w * j]);
		}
		float_t p1 = v[j * w + w - 2];
		float_t p2 = v[j * w + w - 1];
		m_ndf.push_back(max((float_t)0, 2 * p2 - p1));
	}

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: NDF extraction complete\n");
#endif
}